

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O0

bool __thiscall
ithipublisher::GetCurrent(ithipublisher *this,char *metric_name,char *key_value,double *current)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_40 [7];
  bool ret;
  vector<double,_std::allocator<double>_> val;
  double *current_local;
  char *key_value_local;
  char *metric_name_local;
  ithipublisher *this_local;
  
  val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = current;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  bVar1 = GetVector(this,metric_name,key_value,(vector<double,_std::allocator<double>_> *)local_40);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,(long)this->nb_months - 1)
  ;
  *val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_end_of_storage = *pvVar2;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return bVar1;
}

Assistant:

bool ithipublisher::GetCurrent(char const * metric_name, char const * key_value, double * current)
{
    std::vector<double> val;
    bool ret = GetVector(metric_name, key_value, &val);

    *current = val[((size_t)nb_months) - 1];

    return ret;
}